

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntervalMap.h
# Opt level: O3

IndexPair __thiscall
slang::IntervalMap<unsigned_long,std::monostate,0u>::
modifyRoot<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,true>,slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>,true>
          (IntervalMap<unsigned_long,std::monostate,0u> *this,
          LeafNode<unsigned_long,_std::monostate,_11U,_true> *rootNode,uint32_t position,
          allocator_type *alloc)

{
  interval<unsigned_long> *piVar1;
  uint uVar2;
  ulong uVar3;
  unsigned_long uVar4;
  IntervalMap<unsigned_long,std::monostate,0u> *pIVar5;
  bool bVar6;
  interval<unsigned_long> *piVar7;
  uint uVar8;
  ulong *puVar9;
  bool bVar10;
  interval<unsigned_long> *piVar11;
  undefined8 *puVar12;
  ulong uVar13;
  uint *puVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  uint *puVar18;
  int iVar19;
  uint32_t sizes [2];
  uint32_t local_58;
  uint local_54;
  ulong local_50 [2];
  IndexPair local_40;
  IntervalMap<unsigned_long,std::monostate,0u> *local_38;
  
  puVar18 = &local_58;
  puVar14 = &local_58;
  local_38 = this;
  local_40 = IntervalMapDetails::distribute(2,*(uint32_t *)(this + 0xc4),0xb,&local_58,position);
  uVar13 = 0;
  puVar9 = local_50 + 1;
  local_50[1] = 0;
  local_50[0] = 0;
  bVar6 = true;
  do {
    bVar10 = bVar6;
    piVar7 = (interval<unsigned_long> *)
             PoolAllocator<char,192ul,64ul>::
             emplace<slang::IntervalMapDetails::LeafNode<unsigned_long,std::monostate,11u,false>>
                       ((PoolAllocator<char,192ul,64ul> *)alloc);
    pIVar5 = local_38;
    iVar19 = (int)uVar13;
    uVar2 = *puVar18;
    piVar11 = piVar7;
    for (uVar8 = uVar2; uVar8 != 0; uVar8 = uVar8 - 1) {
      piVar1 = (rootNode->
               super_NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U>
               ).first + uVar13;
      uVar4 = piVar1->right;
      ((NodeBase<slang::IntervalMapDetails::interval<unsigned_long>,_std::monostate,_11U> *)
      &piVar11->left)->first[0].left = piVar1->left;
      piVar11->right = uVar4;
      uVar13 = (ulong)((int)uVar13 + 1);
      piVar11 = piVar11 + 1;
    }
    uVar13 = (ulong)(iVar19 + uVar2);
    *puVar9 = (ulong)piVar7 & 0xffffffffffffffc0 | (ulong)(uVar2 - 1);
    puVar9 = local_50;
    puVar18 = &local_54;
    bVar6 = false;
  } while (bVar10);
  lVar17 = 0;
  memset(local_38,0,0xc0);
  puVar9 = local_50 + 1;
  bVar6 = true;
  do {
    bVar10 = bVar6;
    uVar13 = *puVar9;
    puVar12 = (undefined8 *)(uVar13 & 0xffffffffffffffc0);
    uVar15 = puVar12[1];
    if (1 < (ulong)*puVar14) {
      lVar16 = 0;
      do {
        uVar3 = *(ulong *)((long)puVar12 + lVar16 + 0x18);
        if (uVar15 <= uVar3) {
          uVar15 = uVar3;
        }
        lVar16 = lVar16 + 0x10;
      } while ((ulong)*puVar14 * 0x10 + -0x10 != lVar16);
    }
    *(undefined8 *)(pIVar5 + lVar17 * 0x10 + 0x40) = *puVar12;
    *(ulong *)(pIVar5 + lVar17 * 0x10 + 0x48) = uVar15;
    *(ulong *)(pIVar5 + lVar17 * 8) = uVar13;
    lVar17 = 1;
    puVar14 = &local_54;
    puVar9 = local_50;
    bVar6 = false;
  } while (bVar10);
  *(undefined4 *)(pIVar5 + 0xc4) = 2;
  *(int *)(pIVar5 + 0xc0) = *(int *)(pIVar5 + 0xc0) + 1;
  return local_40;
}

Assistant:

IntervalMapDetails::IndexPair IntervalMap<TKey, TValue, N>::modifyRoot(TRootNode& rootNode,
                                                                       uint32_t position,
                                                                       allocator_type& alloc) {
    using namespace IntervalMapDetails;

    // Split the root branch node into two new nodes.
    constexpr uint32_t NumNodes = 2;
    uint32_t sizes[NumNodes];
    IndexPair newOffset = distribute(NumNodes, rootSize, Leaf::Capacity, sizes, position);

    // Construct new nodes.
    uint32_t pos = 0;
    NodeRef nodes[NumNodes];
    for (uint32_t i = 0; i < NumNodes; i++) {
        auto newNode = alloc.template emplace<TNewNode>();
        uint32_t size = sizes[i];

        newNode->copy(rootNode, pos, 0, size);
        nodes[i] = NodeRef(newNode, size);
        pos += size;
    }

    if (SwitchToBranch) {
        // Destroy the old root leaf and switch it to a branch node.
        rootLeaf.~RootLeaf();
        new (&rootBranch) RootBranch();
    }

    for (uint32_t i = 0; i < NumNodes; i++) {
        rootBranch.keyAt(i) = nodes[i].template get<TNewNode>().getBounds(sizes[i]);
        rootBranch.childAt(i) = nodes[i];
    }

    rootSize = NumNodes;
    height++;
    return newOffset;
}